

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

tool_t * create_tool(char *tool_name)

{
  uint uVar1;
  uint uVar2;
  gotcha_configuration_t gVar3;
  char *in_RDI;
  tool_t *newtool;
  char *local_88;
  hash_cmp_t in_stack_ffffffffffffff80;
  FILE *pFVar4;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  tool_t *table;
  char *local_60;
  char *local_40;
  tool_t *local_8;
  
  pFVar4 = _stderr;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    local_40 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                       ,0x2f);
    if (local_40 == (char *)0x0) {
      local_40 = "";
    }
    fprintf(pFVar4,"[%d/%d][%s:%u] - Found no existing tool with name %s\n",(ulong)uVar1,
            (ulong)uVar2,local_40 + 1,0x42,in_RDI);
  }
  local_8 = (tool_t *)malloc(0x58);
  pFVar4 = _stderr;
  if (local_8 == (tool_t *)0x0) {
    if (debug_level != 0) {
      uVar1 = gotcha_gettid();
      uVar2 = getpid();
      local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                         ,0x2f);
      if (local_60 == (char *)0x0) {
        local_60 = "";
      }
      fprintf(pFVar4,"ERROR [%d/%d][%s:%u] - Failed to malloc tool %s\n",(ulong)uVar1,(ulong)uVar2,
              local_60 + 1,0x46,in_RDI);
    }
    local_8 = (tool_t *)0x0;
  }
  else {
    local_8->tool_name = in_RDI;
    local_8->binding = (binding_t *)0x0;
    table = local_8;
    gVar3 = get_default_configuration();
    (table->config).priority = gVar3.priority;
    reorder_tool(local_8);
    local_8->parent_tool = (tool_t *)0x0;
    create_hashtable((hash_table_t *)table,in_stack_ffffffffffffff90,
                     (hash_func_t)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
    if (0 < debug_level) {
      pFVar4 = _stderr;
      uVar1 = gotcha_gettid();
      uVar2 = getpid();
      local_88 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                         ,0x2f);
      if (local_88 == (char *)0x0) {
        local_88 = "";
      }
      fprintf(pFVar4,"[%d/%d][%s:%u] - Created new tool %s\n",(ulong)uVar1,(ulong)uVar2,local_88 + 1
              ,0x52,in_RDI);
    }
  }
  return local_8;
}

Assistant:

tool_t *create_tool(const char *tool_name)
{
   debug_printf(1, "Found no existing tool with name %s\n",tool_name);
   // TODO: ensure free
   tool_t *newtool = (tool_t *) gotcha_malloc(sizeof(tool_t));
   if (!newtool) {
      error_printf("Failed to malloc tool %s\n", tool_name);
      return NULL;
   }
   newtool->tool_name = tool_name;
   newtool->binding = NULL;
   //newtool->next_tool = tools;
   newtool->config = get_default_configuration();
   reorder_tool(newtool);
   newtool->parent_tool = NULL;
   create_hashtable(&newtool->child_tools, 24, 
     (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   //tools = newtool;
   debug_printf(1, "Created new tool %s\n", tool_name);
   return newtool;
}